

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
             *this,char **it)

{
  uint uVar1;
  size_t sVar2;
  char *__s;
  bool bVar3;
  byte *pbVar4;
  ulong uVar5;
  size_t __len;
  char *pcVar6;
  unsigned_long __n2;
  
  sVar2 = *(size_t *)(this + 8);
  if (sVar2 != 0) {
    pcVar6 = *it;
    memmove(pcVar6,*(void **)this,sVar2);
    *it = pcVar6 + sVar2;
  }
  __s = *it;
  sVar2 = *(size_t *)(this + 0x18);
  pcVar6 = __s;
  if (sVar2 != 0) {
    pcVar6 = __s + sVar2;
    memset(__s,*(int *)(this + 0x10),sVar2);
  }
  *it = pcVar6;
  uVar1 = *(uint *)(this + 0x28);
  pbVar4 = (byte *)(__s + sVar2 + uVar1);
  uVar5 = *(ulong *)(this + 0x20);
  do {
    pbVar4 = pbVar4 + -1;
    *pbVar4 = (byte)uVar5 & 1 | 0x30;
    bVar3 = 1 < uVar5;
    uVar5 = uVar5 >> 1;
  } while (bVar3);
  *it = pcVar6 + uVar1;
  return;
}

Assistant:

void operator()(It &&it) const {
      if (prefix.size() != 0)
        it = std::copy_n(prefix.data(), prefix.size(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }